

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

void slang::ast::Lookup::reportUndeclared
               (Scope *initialScope,string_view name,SourceRange range,
               bitmask<slang::ast::LookupFlags> flags,bool isHierarchical,LookupResult *result)

{
  WildcardImportData *pWVar1;
  pointer ppWVar2;
  byte bVar3;
  string_view name_00;
  string_view lookupName;
  string_view lookupName_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  undefined8 uVar4;
  anon_class_16_2_6bb36380 *this;
  bool bVar5;
  uint uVar6;
  InstanceSymbol *pIVar8;
  PackageSymbol *pPVar9;
  Diagnostic *this_00;
  Diagnostic *pDVar10;
  DiagCode code;
  SourceLocation noteLocation;
  InstanceSymbol *this_01;
  Symbol *source;
  Compilation *this_02;
  pointer ppWVar11;
  Scope *this_03;
  string_view arg_03;
  SourceRange range_04;
  int bestDistance;
  Symbol *closestSym;
  anon_class_16_2_6bb36380 isViable;
  anon_class_32_4_3ecd27ba checkMembers;
  undefined1 local_98 [40];
  Symbol *local_70;
  SymbolKind local_68 [2];
  Scope *local_60;
  Compilation *local_58;
  anon_class_32_4_3ecd27ba local_50;
  SymbolKind SVar7;
  
  local_98._8_8_ = name._M_str;
  local_98._0_8_ = name._M_len;
  if ((flags.m_bits & 8) != 0) {
    return;
  }
  if (((flags.m_bits & 0x10) != 0) && (bVar5 = Scope::isUninstantiated(initialScope), bVar5)) {
    return;
  }
  if (((result->flags).m_bits & 4) != 0) {
    return;
  }
  this_02 = initialScope->compilation;
  local_70 = (Symbol *)0x0;
  local_98._36_4_ = 0x7fffffff;
  this_03 = initialScope;
  local_98._16_8_ = range.startLoc;
  local_98._24_8_ = range.endLoc;
  local_58 = this_02;
  while ((local_68[0] = flags.m_bits, local_60 = initialScope, (flags.m_bits & 2) != 0 ||
         (name_00._M_str = (char *)local_98._8_8_, name_00._M_len = local_98._0_8_,
         pIVar8 = (InstanceSymbol *)Scope::find(this_03,name_00), pIVar8 == (InstanceSymbol *)0x0)))
  {
    if (this_02->typoCorrections < (this_02->options).typoCorrectionLimit) {
      local_50.isViable = (anon_class_16_2_6bb36380 *)((long)local_98 + 0x30);
      local_50.bestDistance = (int *)(local_98 + 0x24);
      local_50.closestSym = (Symbol **)((long)local_98 + 0x28);
      local_50.name = (string_view *)local_98;
      reportUndeclared::anon_class_32_4_3ecd27ba::operator()(&local_50,this_03);
      pWVar1 = this_03->importData;
      this_02 = local_58;
      if (pWVar1 != (WildcardImportData *)0x0) {
        ppWVar2 = (pWVar1->wildcardImports).
                  super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppWVar11 = (pWVar1->wildcardImports).
                        super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; this_02 = local_58,
            ppWVar11 != ppWVar2; ppWVar11 = ppWVar11 + 1) {
          pPVar9 = WildcardImportSymbol::getPackage(*ppWVar11);
          if (pPVar9 != (PackageSymbol *)0x0) {
            reportUndeclared::anon_class_32_4_3ecd27ba::operator()(&local_50,&pPVar9->super_Scope);
          }
        }
      }
    }
    this_03 = this_03->thisSym->parentScope;
    if ((this_03 == (Scope *)0x0) ||
       (((flags.m_bits >> 0xe & 1) != 0 && (this_03->thisSym->kind == CompilationUnit))))
    goto LAB_00858b5c;
  }
  this_01 = pIVar8;
  if ((pIVar8->super_InstanceSymbolBase).super_Symbol.kind == TransparentMember) {
    this_01 = (InstanceSymbol *)(pIVar8->super_InstanceSymbolBase).arrayPath._M_ptr;
  }
  if ((local_68[0] & Root) == Unknown) {
    SVar7 = (this_01->super_InstanceSymbolBase).super_Symbol.kind;
    uVar6 = SVar7 - Instance;
    if (uVar6 < 0x28) {
      if ((0x8300420004U >> ((ulong)uVar6 & 0x3f) & 1) != 0) goto LAB_00858dbe;
      if ((ulong)uVar6 != 0) goto LAB_00858e58;
      bVar5 = InstanceSymbol::isInterface(this_01);
    }
    else {
LAB_00858e58:
      bVar5 = Symbol::isValue((Symbol *)this_01);
    }
    if (bVar5 != false) {
LAB_00858daa:
      SVar7 = (this_01->super_InstanceSymbolBase).super_Symbol.kind;
LAB_00858dbe:
      uVar6 = SVar7 - Variable;
      if (uVar6 < 0x19) {
        if ((0x1800c0fU >> (uVar6 & 0x1f) & 1) == 0) {
          if (uVar6 != 4) goto LAB_00858ddd;
          bVar3 = *(byte *)((long)&this_01[1].super_InstanceSymbolBase.arrayPath._M_ptr + 4) & 8;
        }
        else {
          bVar3 = *(byte *)((long)&this_01[2].body + 4) & 2;
        }
        if (bVar3 != 0) goto LAB_00858b5c;
      }
LAB_00858ddd:
      bVar5 = isVisibleFrom((Symbol *)this_01,local_60);
      if (bVar5) {
        range_03.endLoc = (SourceLocation)local_98._24_8_;
        range_03.startLoc = (SourceLocation)local_98._16_8_;
        pDVar10 = Diagnostics::add(&result->diagnostics,initialScope->thisSym,(DiagCode)0x3e000a,
                                   range_03);
        arg_02._M_str = (char *)local_98._8_8_;
        arg_02._M_len = local_98._0_8_;
        Diagnostic::operator<<(pDVar10,arg_02);
        noteLocation = (pIVar8->super_InstanceSymbolBase).super_Symbol.location;
        goto LAB_00858e32;
      }
    }
  }
  else {
    bVar5 = Symbol::isType((Symbol *)this_01);
    if (bVar5) goto LAB_00858daa;
    SVar7 = (this_01->super_InstanceSymbolBase).super_Symbol.kind;
    if ((SVar7 == TypeParameter) || (SVar7 == GenericClassDef)) goto LAB_00858dbe;
  }
LAB_00858b5c:
  lookupName._M_str = (char *)local_98._8_8_;
  lookupName._M_len = local_98._0_8_;
  Compilation::tryGetDefinition((DefinitionLookupResult *)&local_50,this_02,lookupName,initialScope)
  ;
  this = local_50.isViable;
  if (((SourceLocation)local_50.isViable == (SourceLocation)0x0) ||
     (*(SymbolKind *)local_50.isViable != Definition)) {
    lookupName_00._M_str = (char *)local_98._8_8_;
    lookupName_00._M_len = local_98._0_8_;
    pPVar9 = Compilation::getPackage(this_02,lookupName_00);
    uVar4 = local_98._24_8_;
    if (pPVar9 != (PackageSymbol *)0x0) {
      pDVar10 = Diagnostics::add(&result->diagnostics,initialScope->thisSym,(DiagCode)0x33000a,
                                 (SourceLocation)local_98._24_8_);
      arg._M_str = (char *)local_98._8_8_;
      arg._M_len = local_98._0_8_;
      pDVar10 = Diagnostic::operator<<(pDVar10,arg);
      range_04.endLoc = (SourceLocation)uVar4;
      range_04.startLoc = (SourceLocation)local_98._16_8_;
      Diagnostic::operator<<(pDVar10,range_04);
      return;
    }
    this_02->typoCorrections = this_02->typoCorrections + 1;
    if ((0 < (int)local_98._36_4_ && local_70 != (Symbol *)0x0) &&
       (2 < (ulong)local_98._0_8_ / (ulong)(uint)local_98._36_4_)) {
      range_00.endLoc = (SourceLocation)local_98._24_8_;
      range_00.startLoc = (SourceLocation)local_98._16_8_;
      pDVar10 = Diagnostics::add(&result->diagnostics,initialScope->thisSym,(DiagCode)0x32000a,
                                 range_00);
      arg_00._M_str = (char *)local_98._8_8_;
      arg_00._M_len = local_98._0_8_;
      this_00 = Diagnostic::operator<<(pDVar10,arg_00);
      Diagnostic::operator<<(this_00,*(string_view *)((long)local_70 + 8));
      noteLocation = *(SourceLocation *)((long)local_70 + 0x18);
LAB_00858e32:
      Diagnostic::addNote(pDVar10,(DiagCode)0x50001,noteLocation);
      return;
    }
    source = initialScope->thisSym;
    code.subsystem = Lookup;
    code.code = 0x34;
  }
  else {
    if (!isHierarchical) {
      range_02.endLoc = (SourceLocation)local_98._24_8_;
      range_02.startLoc = (SourceLocation)local_98._16_8_;
      pDVar10 = Diagnostics::add(&result->diagnostics,initialScope->thisSym,
                                 (DiagCode)((uint)((flags.m_bits & 1) == 0) << 0x10 | 0x6000a),
                                 range_02);
      arg_01._M_str = (char *)local_98._8_8_;
      arg_01._M_len = local_98._0_8_;
      pDVar10 = Diagnostic::operator<<(pDVar10,arg_01);
      arg_03 = DefinitionSymbol::getArticleKindString((DefinitionSymbol *)this);
      goto LAB_00858d8a;
    }
    source = initialScope->thisSym;
    code.subsystem = Lookup;
    code.code = 5;
  }
  range_01.endLoc = (SourceLocation)local_98._24_8_;
  range_01.startLoc = (SourceLocation)local_98._16_8_;
  pDVar10 = Diagnostics::add(&result->diagnostics,source,code,range_01);
  arg_03._M_str = (char *)local_98._8_8_;
  arg_03._M_len = local_98._0_8_;
LAB_00858d8a:
  Diagnostic::operator<<(pDVar10,arg_03);
  return;
}

Assistant:

void Lookup::reportUndeclared(const Scope& initialScope, std::string_view name, SourceRange range,
                              bitmask<LookupFlags> flags, bool isHierarchical,
                              LookupResult& result) {
    // If the caller doesn't want an error, don't give him one.
    if (flags.has(LookupFlags::NoUndeclaredError) ||
        (flags.has(LookupFlags::NoUndeclaredErrorIfUninstantiated) &&
         initialScope.isUninstantiated())) {
        return;
    }

    // If we observed a wildcard import we couldn't resolve, we shouldn't report an
    // error for an undeclared identifier because maybe it's supposed to come from that package.
    // In particular it's important that we do this because when we first look at a
    // definition because it's possible we haven't seen the file containing the package yet.
    // This also gets set for class scopes that have an error base class.
    if (result.flags.has(LookupResultFlags::SuppressUndeclared))
        return;

    // The symbol wasn't found, so this is an error. The only question is how helpful we can
    // make that error. Let's try to find the closest named symbol in all reachable scopes,
    // including package imports, to provide a "did you mean" diagnostic. If along the way
    // we happen to actually find the symbol but it's declared later in the source text,
    // we will use that to issue a "used before declared" diagnostic.
    auto& comp = initialScope.getCompilation();
    const Symbol* actualSym = nullptr;
    const Symbol* closestSym = nullptr;
    int bestDistance = INT_MAX;
    bool usedBeforeDeclared = false;
    auto scope = &initialScope;
    while (true) {
        // This lambda returns true if the given symbol is a viable candidate
        // for the kind of lookup that was being performed.
        auto isViable = [flags, &initialScope](const Symbol& sym) {
            const Symbol* s = &sym;
            if (s->kind == SymbolKind::TransparentMember)
                s = &s->as<TransparentMemberSymbol>().wrapped;

            if (flags.has(LookupFlags::Type)) {
                if (!s->isType() && s->kind != SymbolKind::TypeParameter &&
                    s->kind != SymbolKind::GenericClassDef) {
                    return false;
                }
            }
            else {
                switch (s->kind) {
                    case SymbolKind::Subroutine:
                    case SymbolKind::InstanceArray:
                    case SymbolKind::Sequence:
                    case SymbolKind::Property:
                    case SymbolKind::Checker:
                    case SymbolKind::UninstantiatedDef:
                        break;
                    case SymbolKind::Instance:
                        if (!s->as<InstanceSymbol>().isInterface())
                            return false;
                        break;
                    default:
                        if (!s->isValue())
                            return false;
                        break;
                }
            }

            // Ignore special members.
            if (s->kind == SymbolKind::Subroutine &&
                s->as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
                return false;
            }

            if (VariableSymbol::isKind(s->kind) &&
                s->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {
                return false;
            }

            if (!isVisibleFrom(*s, initialScope))
                return false;

            return true;
        };

        if (!flags.has(LookupFlags::AllowDeclaredAfter)) {
            actualSym = scope->find(name);
            if (actualSym) {
                usedBeforeDeclared = isViable(*actualSym);
                break;
            }
        }

        // Only check for typos if that functionality is enabled -- it can be
        // disabled by config or if we've tried too many times to correct typos.
        if (comp.doTypoCorrection()) {
            auto checkMembers = [&](const Scope& toCheck) {
                for (auto& member : toCheck.members()) {
                    if (member.name.empty() || !isViable(member))
                        continue;

                    int dist = editDistance(member.name, name, /* allowReplacements */ true,
                                            bestDistance);
                    if (dist < bestDistance) {
                        closestSym = &member;
                        bestDistance = dist;
                    }
                }
            };

            // Check the current scope.
            checkMembers(*scope);

            // Also search in package imports.
            if (auto importData = scope->getWildcardImportData()) {
                for (auto import : importData->wildcardImports) {
                    auto package = import->getPackage();
                    if (package)
                        checkMembers(*package);
                }
            }
        }

        scope = scope->asSymbol().getParentScope();
        if (!scope || (scope->asSymbol().kind == SymbolKind::CompilationUnit &&
                       flags.has(LookupFlags::DisallowUnitReferences))) {
            break;
        }
    }

    // If we found the actual named symbol and it's viable for our kind of lookup,
    // report a diagnostic about it being used before declared.
    if (usedBeforeDeclared) {
        auto& diag = result.addDiag(initialScope, diag::UsedBeforeDeclared, range);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, actualSym->location);
        return;
    }

    // Otherwise, check if this names a definition, in which case we can give a nicer error.
    if (auto def = comp.tryGetDefinition(name, initialScope).definition;
        def && def->kind == SymbolKind::Definition) {
        if (isHierarchical) {
            result.addDiag(initialScope, diag::CouldNotResolveHierarchicalPath, range) << name;
        }
        else {
            auto code = flags.has(LookupFlags::Type) ? diag::DefinitionUsedAsType
                                                     : diag::DefinitionUsedAsValue;
            result.addDiag(initialScope, code, range)
                << name << def->as<DefinitionSymbol>().getArticleKindString();
        }
        return;
    }

    // Also check for a package with this name.
    if (comp.getPackage(name)) {
        result.addDiag(initialScope, diag::UndeclaredButFoundPackage, range.end()) << name << range;
        return;
    }

    // Count the number of times we've performed typo correction.
    comp.didTypoCorrection();

    // See if we found a viable symbol with a name that's somewhat close to the one we wanted.
    // If we did, assume that the user made a typo and report it.
    if (closestSym && bestDistance > 0 && name.length() / size_t(bestDistance) >= 3) {
        auto& diag = result.addDiag(initialScope, diag::TypoIdentifier, range);
        diag << name << closestSym->name;
        diag.addNote(diag::NoteDeclarationHere, closestSym->location);
        return;
    }

    // We couldn't make any sense of this, just report a simple error about a missing identifier.
    result.addDiag(initialScope, diag::UndeclaredIdentifier, range) << name;
}